

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall Highs::scaleRowInterface(Highs *this,HighsInt row,double scale_value)

{
  pointer pHVar1;
  pointer pcVar2;
  HighsStatus HVar3;
  long lVar4;
  HighsBasisStatus HVar5;
  char cVar6;
  allocator local_a9;
  double local_a8;
  string local_a0;
  HighsLogOptions local_80;
  
  local_a8 = scale_value;
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  if ((local_a8 == 0.0) && (!NAN(local_a8))) {
    return kError;
  }
  if (row < 0) {
    return kError;
  }
  if ((this->model_).lp_.num_row_ <= row) {
    return kError;
  }
  HighsLogOptions::HighsLogOptions(&local_80,&(this->options_).super_HighsOptionsStruct.log_options)
  ;
  HVar3 = applyScalingToLpRow(&(this->model_).lp_,row,local_a8);
  std::__cxx11::string::string((string *)&local_a0,"applyScalingToLpRow",&local_a9);
  HVar3 = interpretCallStatus(&local_80,HVar3,kOk,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::_Function_base::~_Function_base(&local_80.user_callback.super__Function_base);
  if (HVar3 == kError) {
    return kError;
  }
  if (0.0 <= local_a8) goto LAB_00251f76;
  if ((this->basis_).valid == true) {
    pHVar1 = (this->basis_).row_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    HVar5 = pHVar1[(uint)row];
    if (HVar5 == kLower) {
      HVar5 = kUpper;
    }
    else {
      if (HVar5 != kUpper) goto LAB_00251f2e;
      HVar5 = kLower;
    }
    pHVar1[(uint)row] = HVar5;
  }
LAB_00251f2e:
  if (((local_a8 < 0.0) && ((this->ekk_instance_).status_.initialised_for_solve != false)) &&
     ((this->ekk_instance_).status_.has_basis == true)) {
    lVar4 = (long)row + (long)(this->model_).lp_.num_col_;
    pcVar2 = (this->ekk_instance_).basis_.nonbasicMove_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    cVar6 = pcVar2[lVar4];
    if (cVar6 == '\x01') {
      cVar6 = -1;
    }
    else {
      if (cVar6 != -1) goto LAB_00251f76;
      cVar6 = '\x01';
    }
    pcVar2[lVar4] = cVar6;
  }
LAB_00251f76:
  invalidateModelStatusSolutionAndInfo(this);
  HEkk::updateStatus(&this->ekk_instance_,kScaledRow);
  return kOk;
}

Assistant:

HighsStatus Highs::scaleRowInterface(const HighsInt row,
                                     const double scale_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsSimplexStatus& simplex_status = ekk_instance_.status_;

  // Ensure that the LP is column-wise
  lp.ensureColwise();

  if (row < 0) return HighsStatus::kError;
  if (row >= lp.num_row_) return HighsStatus::kError;
  if (!scale_value) return HighsStatus::kError;

  return_status = interpretCallStatus(options_.log_options,
                                      applyScalingToLpRow(lp, row, scale_value),
                                      return_status, "applyScalingToLpRow");
  if (return_status == HighsStatus::kError) return return_status;

  if (scale_value < 0 && basis.valid) {
    // Negative, so flip any nonbasic status
    if (basis.row_status[row] == HighsBasisStatus::kLower) {
      basis.row_status[row] = HighsBasisStatus::kUpper;
    } else if (basis.row_status[row] == HighsBasisStatus::kUpper) {
      basis.row_status[row] = HighsBasisStatus::kLower;
    }
  }
  if (simplex_status.initialised_for_solve) {
    SimplexBasis& simplex_basis = ekk_instance_.basis_;
    if (scale_value < 0 && simplex_status.has_basis) {
      // Negative, so flip any nonbasic status
      const HighsInt var = lp.num_col_ + row;
      if (simplex_basis.nonbasicMove_[var] == kNonbasicMoveUp) {
        simplex_basis.nonbasicMove_[var] = kNonbasicMoveDn;
      } else if (simplex_basis.nonbasicMove_[var] == kNonbasicMoveDn) {
        simplex_basis.nonbasicMove_[var] = kNonbasicMoveUp;
      }
    }
  }
  // Deduce the consequences of a scaled row
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kScaledRow);
  return HighsStatus::kOk;
}